

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_header.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 *puVar2;
  char *pcVar3;
  int count;
  char *s;
  CMimeHeader_T *h;
  char **argv_local;
  int argc_local;
  
  puVar2 = (undefined8 *)cmime_header_new();
  if (puVar2 == (undefined8 *)0x0) {
    __assert_fail("h",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_header.c"
                  ,0x26,"int main(int, const char **)");
  }
  cmime_header_set_name(puVar2,header_string1_key);
  iVar1 = strcmp((char *)*puVar2,header_string1_key);
  if (iVar1 != 0) {
    __assert_fail("strcmp(s,header_string1_key)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_header.c"
                  ,0x2a,"int main(int, const char **)");
  }
  cmime_header_set_value(puVar2,header_string1_value,0);
  if ((int)puVar2[2] != 1) {
    __assert_fail("count == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_header.c"
                  ,0x2e,"int main(int, const char **)");
  }
  pcVar3 = (char *)cmime_header_get_value(puVar2,0);
  iVar1 = strcmp(pcVar3,header_string1_value);
  if (iVar1 != 0) {
    __assert_fail("strcmp(s,header_string1_value)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_header.c"
                  ,0x32,"int main(int, const char **)");
  }
  pcVar3 = (char *)cmime_header_to_string(puVar2);
  iVar1 = strcmp(pcVar3,header_string1);
  if (iVar1 != 0) {
    __assert_fail("strcmp(s,header_string1)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_header.c"
                  ,0x35,"int main(int, const char **)");
  }
  free(pcVar3);
  cmime_header_set_value(puVar2,header_string2_value,0);
  if ((int)puVar2[2] != 2) {
    __assert_fail("count == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_header.c"
                  ,0x3b,"int main(int, const char **)");
  }
  pcVar3 = (char *)cmime_header_get_value(puVar2,0);
  iVar1 = strcmp(pcVar3,header_string1_value);
  if (iVar1 != 0) {
    __assert_fail("strcmp(s,header_string1_value)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_header.c"
                  ,0x3f,"int main(int, const char **)");
  }
  pcVar3 = (char *)cmime_header_get_value(puVar2,1);
  iVar1 = strcmp(pcVar3,header_string2_value);
  if (iVar1 == 0) {
    cmime_header_set_value(puVar2,test_string1,1);
    pcVar3 = (char *)cmime_header_get_value(puVar2,0);
    iVar1 = strcmp(pcVar3,test_string1);
    if (iVar1 != 0) {
      __assert_fail("strcmp(s,test_string1)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_header.c"
                    ,0x48,"int main(int, const char **)");
    }
    if ((int)puVar2[2] == 1) {
      cmime_header_free(puVar2);
      return 0;
    }
    __assert_fail("count == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_header.c"
                  ,0x4b,"int main(int, const char **)");
  }
  __assert_fail("strcmp(s,header_string2_value)==0",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_header.c"
                ,0x43,"int main(int, const char **)");
}

Assistant:

int main (int argc, char const *argv[]) {
    CMimeHeader_T *h;
    char *s = NULL;
    int count;
    
    h = cmime_header_new();
    assert(h);
    
    cmime_header_set_name(h,header_string1_key);
    s = cmime_header_get_name(h);
    assert(strcmp(s,header_string1_key)==0);
    
    cmime_header_set_value(h,header_string1_value,0);
    count = cmime_header_get_count(h);
    assert(count == 1);

    // fetch first value
    s = cmime_header_get_value(h,0);
    assert(strcmp(s,header_string1_value)==0);
        
    s = cmime_header_to_string(h);
    assert(strcmp(s,header_string1)==0);
    free(s);
        
    // add another header value
    cmime_header_set_value(h,header_string2_value,0);
    count = cmime_header_get_count(h);
    assert(count == 2);
        
    // check first value again
    s = cmime_header_get_value(h,0);
    assert(strcmp(s,header_string1_value)==0);
        
    // check second value
    s = cmime_header_get_value(h,1);
    assert(strcmp(s,header_string2_value)==0);
    
    // now overwrite header values
    cmime_header_set_value(h,test_string1,1);
    s = cmime_header_get_value(h,0);
    assert(strcmp(s,test_string1)==0);
    
    count = cmime_header_get_count(h);
    assert(count == 1);
    
    cmime_header_free(h);
    return(0);
}